

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdHACD.cpp
# Opt level: O3

double __thiscall
HACD::HACD::Concavity
          (HACD *this,ICHUll *ch,
          map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
          *distPoints)

{
  size_t sVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  Vec3<double> *normal;
  Vec3<double> *pt;
  _Rb_tree_header *p_Var4;
  long lVar5;
  ulong name;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  double local_40;
  undefined1 extraout_var [56];
  
  p_Var3 = (distPoints->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(distPoints->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 == p_Var4) {
    local_40 = 0.0;
  }
  else {
    sVar1 = this->m_nPoints;
    local_40 = 0.0;
    do {
      if (*(char *)&p_Var3[1]._M_right == '\0') {
        name = *(ulong *)(p_Var3 + 1);
        lVar5 = name - sVar1;
        if ((long)name < (long)sVar1) {
          if ((long)name < 0) {
            pt = this->m_facePoints + ~name;
            normal = this->m_faceNormals + ~name;
          }
          else {
            pt = this->m_points + name;
            normal = this->m_normals + name;
          }
        }
        else {
          bVar2 = ICHUll::IsInside(ch,this->m_extraDistPoints + lVar5,-0.001);
          auVar6 = ZEXT816(0) << 0x40;
          if (!bVar2) goto LAB_008411fb;
          name = *(ulong *)(p_Var3 + 1);
          pt = this->m_extraDistPoints + lVar5;
          normal = this->m_extraDistNormals + lVar5;
        }
        auVar7._0_8_ = ICHUll::ComputeDistance(ch,name,pt,normal,(bool *)&p_Var3[1]._M_right,true);
        auVar7._8_56_ = extraout_var;
        auVar6 = auVar7._0_16_;
      }
      else {
        auVar6._8_8_ = 0;
        auVar6._0_8_ = p_Var3[1]._M_left;
      }
LAB_008411fb:
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_40;
      auVar6 = vmaxsd_avx(auVar6,auVar8);
      local_40 = auVar6._0_8_;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return local_40;
}

Assistant:

double  HACD::Concavity(ICHUll & ch, std::map<long, DPoint> & distPoints)
    {
		double concavity = 0.0;
		double distance = 0.0;       
		std::map<long, DPoint>::iterator itDP(distPoints.begin());
		std::map<long, DPoint>::iterator itDPEnd(distPoints.end());
		long pt;
		const long nPoints = static_cast<long>(m_nPoints);
		const double eps = -0.001;
		for(; itDP != itDPEnd; ++itDP) 
		{
            if (!(itDP->second).m_computed)
            {
                if (itDP->first >= nPoints)
                {
					pt = itDP->first - nPoints;
					if ( ch.IsInside(m_extraDistPoints[pt], eps))
					{
						distance = ch.ComputeDistance(itDP->first, m_extraDistPoints[pt], m_extraDistNormals[pt], (itDP->second).m_computed, true);
					}
					else
					{
						distance = 0.0;
					}
                }
				else if (itDP->first >= 0)
                {
					pt = itDP->first;
					distance = ch.ComputeDistance(itDP->first, m_points[pt], m_normals[pt], (itDP->second).m_computed, true);
                }
                else
                {
					pt = -itDP->first-1;
					distance = ch.ComputeDistance(itDP->first, m_facePoints[pt], m_faceNormals[pt], (itDP->second).m_computed, true);
				}
            }
            else
            {
                distance = (itDP->second).m_dist;
            }

			if (concavity < distance) 
			{
				concavity = distance;
			}
		}
		return concavity;
    }